

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O0

vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> * __thiscall
HighsImplications::getImplications(HighsImplications *this,HighsInt col,bool val,bool *infeasible)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined1 *in_RCX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  HighsInt loc;
  undefined1 in_stack_00000253;
  HighsInt in_stack_00000254;
  HighsImplications *in_stack_00000258;
  
  iVar2 = in_ESI * 2 + (uint)(in_DL & 1);
  pvVar3 = std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::
           operator[]((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                       *)(in_RDI + 8),(long)iVar2);
  if ((pvVar3->computed & 1U) == 0) {
    bVar1 = computeImplications(in_stack_00000258,in_stack_00000254,(bool)in_stack_00000253);
    *in_RCX = bVar1;
  }
  else {
    *in_RCX = 0;
  }
  pvVar3 = std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::
           operator[]((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                       *)(in_RDI + 8),(long)iVar2);
  return &pvVar3->implics;
}

Assistant:

const std::vector<HighsDomainChange>& getImplications(HighsInt col, bool val,
                                                        bool& infeasible) {
    HighsInt loc = 2 * col + val;
    if (!implications[loc].computed)
      infeasible = computeImplications(col, val);
    else
      infeasible = false;

    assert(implications[loc].computed);

    return implications[loc].implics;
  }